

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O1

bool __thiscall
S2BooleanOperation::Impl::ProcessIncidentEdges
          (Impl *this,ShapeEdge *a,S2ContainsPointQuery<S2ShapeIndex> *query,CrossingProcessor *cp)

{
  pointer *ppIVar1;
  pointer pIVar2;
  pointer pIVar3;
  iterator __position;
  ShapeEdgeId SVar4;
  ShapeEdgeId a_id;
  long lVar5;
  byte bVar6;
  int iVar7;
  undefined4 uVar8;
  ulong uVar9;
  __normal_iterator<S2BooleanOperation::Impl::IndexCrossing_*,_std::vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>_>
  _Var10;
  undefined4 extraout_var;
  CrossingIterator next_crossing;
  _Any_data local_68;
  code *local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined1 local_3c;
  
  pIVar2 = (this->tmp_crossings_).
           super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->tmp_crossings_).
      super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar2) {
    (this->tmp_crossings_).
    super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar2;
  }
  uStack_50 = std::
              _Function_handler<bool_(const_s2shapeutil::ShapeEdge_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc:1851:37)>
              ::_M_invoke;
  local_58 = std::
             _Function_handler<bool_(const_s2shapeutil::ShapeEdge_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc:1851:37)>
             ::_M_manager;
  local_68._M_unused._M_object = a;
  local_68._8_8_ = this;
  S2ContainsPointQuery<S2ShapeIndex>::VisitIncidentEdges
            (query,&(a->edge_).v0,(EdgeVisitor *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  pIVar2 = (this->tmp_crossings_).
           super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar3 = (this->tmp_crossings_).
           super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar2 == pIVar3) {
    bVar6 = cp->inside_ ^ 1;
  }
  else {
    uVar9 = ((long)pIVar3 - (long)pIVar2 >> 2) * -0x3333333333333333;
    if (1 < uVar9) {
      lVar5 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<S2BooleanOperation::Impl::IndexCrossing*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pIVar2,pIVar3,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<S2BooleanOperation::Impl::IndexCrossing*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pIVar2,pIVar3);
      _Var10 = std::
               __adjacent_find<__gnu_cxx::__normal_iterator<S2BooleanOperation::Impl::IndexCrossing*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                         ((this->tmp_crossings_).
                          super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->tmp_crossings_).
                          super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      if (_Var10._M_current !=
          (this->tmp_crossings_).
          super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&local_68,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                   ,0x749,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_68._8_8_,
                   "Check failed: std::adjacent_find(tmp_crossings_.begin(), tmp_crossings_.end()) == tmp_crossings_.end() "
                   ,0x67);
        abort();
      }
    }
    SVar4 = kSentinel;
    local_68._M_unused._M_object = (void *)kSentinel;
    local_68._8_4_ = kSentinel.shape_id;
    local_68._12_4_ = kSentinel.edge_id;
    local_58 = (code *)((ulong)local_58 & 0xfffffffffffffff8);
    __position._M_current =
         (this->tmp_crossings_).
         super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->tmp_crossings_).
        super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
      ::_M_realloc_insert<S2BooleanOperation::Impl::IndexCrossing>
                (&this->tmp_crossings_,__position,(IndexCrossing *)&local_68);
    }
    else {
      *(undefined4 *)&(__position._M_current)->field_0x10 = local_58._0_4_;
      local_68._0_4_ = SVar4.shape_id;
      local_68._4_4_ = SVar4.edge_id;
      ((__position._M_current)->a).shape_id = local_68._0_4_;
      ((__position._M_current)->a).edge_id = local_68._4_4_;
      ((__position._M_current)->b).shape_id = local_68._0_4_;
      ((__position._M_current)->b).edge_id = local_68._4_4_;
      ppIVar1 = &(this->tmp_crossings_).
                 super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppIVar1 = *ppIVar1 + 1;
    }
    local_68._M_unused._M_object = query->index_;
    local_68._8_8_ =
         (this->tmp_crossings_).
         super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
         ._M_impl.super__Vector_impl_data._M_start;
    uStack_50 = (code *)CONCAT44(uStack_50._4_4_,0xffffffff);
    local_3c = 0;
    SVar4.shape_id = (((pointer)local_68._8_8_)->a).shape_id;
    SVar4.edge_id = (((pointer)local_68._8_8_)->a).edge_id;
    if (SVar4 != kSentinel) {
      iVar7 = (((pointer)local_68._8_8_)->b).shape_id;
      if (iVar7 != -1) {
        uStack_50 = (code *)CONCAT44(uStack_50._4_4_,iVar7);
        iVar7 = (*((S2ShapeIndex *)local_68._M_unused._0_8_)->_vptr_S2ShapeIndex[3])();
        local_58 = (code *)CONCAT44(extraout_var,iVar7);
        uVar8 = (**(code **)(*(long *)local_58 + 0x20))(local_58);
        uStack_50 = (code *)CONCAT44(uVar8,(undefined4)uStack_50);
        local_48 = 0xffffffff;
      }
    }
    a_id.shape_id = (a->id_).shape_id;
    a_id.edge_id = (a->id_).edge_id;
    bVar6 = CrossingProcessor::ProcessEdge(cp,a_id,(CrossingIterator *)&local_68);
  }
  return (bool)bVar6;
}

Assistant:

bool S2BooleanOperation::Impl::ProcessIncidentEdges(
    const ShapeEdge& a, S2ContainsPointQuery<S2ShapeIndex>* query,
    CrossingProcessor* cp) {
  tmp_crossings_.clear();
  query->VisitIncidentEdges(a.v0(), [&a, this](const ShapeEdge& b) {
      return AddIndexCrossing(a, b, false /*is_interior*/, &tmp_crossings_);
    });
  // Fast path for the common case where there are no incident edges.  We
  // return false (terminating early) if the first chain edge will be emitted.
  if (tmp_crossings_.empty()) {
    return !cp->inside();
  }
  // Otherwise we invoke the full CrossingProcessor logic to determine whether
  // the first chain edge will be emitted.
  if (tmp_crossings_.size() > 1) {
    std::sort(tmp_crossings_.begin(), tmp_crossings_.end());
    // VisitIncidentEdges() should not generate any duplicate values.
    S2_DCHECK(std::adjacent_find(tmp_crossings_.begin(), tmp_crossings_.end()) ==
           tmp_crossings_.end());
  }
  tmp_crossings_.push_back(IndexCrossing(kSentinel, kSentinel));
  CrossingIterator next_crossing(&query->index(), &tmp_crossings_,
                                 false /*crossings_complete*/);
  return cp->ProcessEdge(a.id(),  &next_crossing);
}